

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

char remap(symbol s)

{
  char cVar1;
  
  cVar1 = 'X';
  if (s < 4) {
    cVar1 = (char)(0x73706d69 >> ((s & 3) << 3));
  }
  return cVar1;
}

Assistant:

char remap(symbol s){

	switch(s){
		case 0: return 'i';
		case 1: return 'm';
		case 2: return 'p';
		case 3: return 's';
	}

	return 'X';

}